

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# amapGraph.c
# Opt level: O2

Amap_Obj_t * Amap_ManCreateAnd(Amap_Man_t *p,Amap_Obj_t *pFan0,Amap_Obj_t *pFan1)

{
  uint uVar1;
  int iVar2;
  int iVar3;
  uint uVar4;
  Amap_Obj_t *pAVar5;
  uint uVar6;
  uint *puVar7;
  uint *puVar8;
  
  pAVar5 = Amap_ManSetupObj(p);
  *(ulong *)pAVar5 = *(ulong *)pAVar5 & 0xfffffffffffffff8 | 4;
  puVar7 = (uint *)((ulong)pFan0 & 0xfffffffffffffffe);
  pAVar5->Fan[0] = ((uint)pFan0 & 1) + (*puVar7 >> 3) * 2;
  puVar7[4] = puVar7[4] + 1;
  puVar8 = (uint *)((ulong)pFan1 & 0xfffffffffffffffe);
  pAVar5->Fan[1] = ((uint)pFan1 & 1) + (*puVar8 >> 3) * 2;
  puVar8[4] = puVar8[4] + 1;
  iVar2 = Abc_Lit2Var(pAVar5->Fan[0]);
  iVar3 = Abc_Lit2Var(pAVar5->Fan[1]);
  if (iVar2 == iVar3) {
    __assert_fail("Abc_Lit2Var(pObj->Fan[0]) != Abc_Lit2Var(pObj->Fan[1])",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/amap/amapGraph.c"
                  ,0x90,"Amap_Obj_t *Amap_ManCreateAnd(Amap_Man_t *, Amap_Obj_t *, Amap_Obj_t *)");
  }
  *(ulong *)pAVar5 =
       *(ulong *)pAVar5 & 0xdfffffffffffffff |
       (ulong)(((uint)((ulong)*(undefined8 *)puVar8 >> 0x3d) ^ (uint)pFan1) &
               ((uint)((ulong)*(undefined8 *)puVar7 >> 0x3d) ^ (uint)pFan0) & 1) << 0x3d;
  uVar1 = puVar8[2];
  if ((int)puVar8[2] < (int)puVar7[2]) {
    uVar1 = puVar7[2];
  }
  uVar4 = uVar1 + 1;
  pAVar5->Level = uVar4;
  uVar6 = p->nLevelMax;
  if (p->nLevelMax <= (int)uVar1) {
    p->nLevelMax = uVar4;
    uVar6 = uVar4;
  }
  if ((int)uVar6 < 0xffe) {
    p->nObjs[4] = p->nObjs[4] + 1;
    return pAVar5;
  }
  __assert_fail("p->nLevelMax < 4094",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/amap/amapGraph.c"
                ,0x95,"Amap_Obj_t *Amap_ManCreateAnd(Amap_Man_t *, Amap_Obj_t *, Amap_Obj_t *)");
}

Assistant:

Amap_Obj_t * Amap_ManCreateAnd( Amap_Man_t * p, Amap_Obj_t * pFan0, Amap_Obj_t * pFan1 )
{
    Amap_Obj_t * pObj;
    pObj = Amap_ManSetupObj( p );
    pObj->Type   = AMAP_OBJ_AND;
    pObj->Fan[0] = Amap_ObjToLit(pFan0);  Amap_Regular(pFan0)->nRefs++;
    pObj->Fan[1] = Amap_ObjToLit(pFan1);  Amap_Regular(pFan1)->nRefs++;
    assert( Abc_Lit2Var(pObj->Fan[0]) != Abc_Lit2Var(pObj->Fan[1]) );
    pObj->fPhase = Amap_ObjPhaseReal(pFan0) & Amap_ObjPhaseReal(pFan1);
    pObj->Level  = 1 + Abc_MaxInt( Amap_Regular(pFan0)->Level, Amap_Regular(pFan1)->Level );
    if ( p->nLevelMax < (int)pObj->Level )
        p->nLevelMax = (int)pObj->Level;
    assert( p->nLevelMax < 4094 ); // 2^12-2
    p->nObjs[AMAP_OBJ_AND]++;
    return pObj;
}